

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
          (ScriptContext *this,FunctionBody *functionBody,
          WriteBarrierPtr<Js::DynamicProfileInfo> *dynamicProfileInfo)

{
  SourceDynamicProfileManager *this_00;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_01;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  ScriptContext *pSVar4;
  undefined4 *puVar5;
  SourceContextInfo *pSVar6;
  DynamicProfileInfo *pDVar7;
  FunctionInfo *pFVar8;
  DynamicProfileInfo *local_38;
  DynamicProfileInfo *newDynamicProfileInfo;
  
  pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar4 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161e,"(functionBody->GetScriptContext() == this)",
                                "functionBody->GetScriptContext() == this");
    if (!bVar2) goto LAB_007944ef;
    *puVar5 = 0;
  }
  bVar2 = FunctionBody::HasValidSourceInfo(functionBody);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161f,"(functionBody->HasValidSourceInfo())",
                                "functionBody->HasValidSourceInfo()");
    if (!bVar2) goto LAB_007944ef;
    *puVar5 = 0;
  }
  pDVar7 = dynamicProfileInfo->ptr;
  local_38 = pDVar7;
  pSVar6 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
  this_00 = (pSVar6->sourceDynamicProfileManager).ptr;
  if ((pSVar6->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar6->isHostDynamicDocument & 1U) != 0)) {
    if (this_00 == (SourceDynamicProfileManager *)0x0) {
      if (pDVar7 == (DynamicProfileInfo *)0x0) {
        pDVar7 = FunctionBody::AllocateDynamicProfile(functionBody);
        local_38 = pDVar7;
      }
      Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
      dynamicProfileInfo->ptr = pDVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
    }
    else {
      if (pDVar7 == (DynamicProfileInfo *)0x0) {
        pDVar7 = DynamicProfileInfo::New(this->recycler,functionBody,true);
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        local_38 = pDVar7;
        if (pFVar8 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_007944ef;
          *puVar5 = 0;
          pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        SourceDynamicProfileManager::UpdateDynamicProfileInfo(this_00,pFVar8->functionId,pDVar7);
        Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
        dynamicProfileInfo->ptr = pDVar7;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
      }
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_007944ef;
        *puVar5 = 0;
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      SourceDynamicProfileManager::MarkAsExecuted(this_00,pFVar8->functionId);
      DynamicProfileInfo::UpdateFunctionInfo(pDVar7,functionBody,this->recycler);
    }
  }
  else {
    if (pDVar7 == (DynamicProfileInfo *)0x0) {
      pDVar7 = FunctionBody::AllocateDynamicProfile(functionBody);
      local_38 = pDVar7;
      Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
      dynamicProfileInfo->ptr = pDVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
    }
    uVar3 = FunctionBody::GetInterpretedCount(functionBody);
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1643,"(functionBody->GetInterpretedCount() == 0)",
                                  "functionBody->GetInterpretedCount() == 0");
      if (!bVar2) goto LAB_007944ef;
      *puVar5 = 0;
    }
    this_01 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (this_01 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Prepend
                (this_01,this->recycler,&local_38);
    }
    if (this->startupComplete == false) {
      if (this_00 == (SourceDynamicProfileManager *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x164d,"(profileManager)","profileManager");
        if (!bVar2) goto LAB_007944ef;
        *puVar5 = 0;
      }
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_007944ef;
        *puVar5 = 0;
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      SourceDynamicProfileManager::MarkAsExecuted(this_00,pFVar8->functionId);
    }
  }
  if (dynamicProfileInfo->ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1651,"(dynamicProfileInfo != nullptr)",
                                "dynamicProfileInfo != nullptr");
    if (!bVar2) {
LAB_007944ef:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void ScriptContext::AddDynamicProfileInfo(
        FunctionBody * functionBody, BarrierT<DynamicProfileInfo>& dynamicProfileInfo)
    {
        Assert(functionBody->GetScriptContext() == this);
        Assert(functionBody->HasValidSourceInfo());

        DynamicProfileInfo * newDynamicProfileInfo = dynamicProfileInfo;
        // If it is a dynamic script - we should create a profile info bound to the threadContext for its lifetime.
        SourceContextInfo* sourceContextInfo = functionBody->GetSourceContextInfo();
        SourceDynamicProfileManager* profileManager = sourceContextInfo->sourceDynamicProfileManager;
        if (sourceContextInfo->IsDynamic())
        {
            if (profileManager != nullptr)
            {
                // There is an in-memory cache and dynamic profile info is coming from there
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = DynamicProfileInfo::New(this->GetRecycler(), functionBody, true /* persistsAcrossScriptContexts */);
                    profileManager->UpdateDynamicProfileInfo(functionBody->GetLocalFunctionId(), newDynamicProfileInfo);
                    dynamicProfileInfo = newDynamicProfileInfo;
                }
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
                newDynamicProfileInfo->UpdateFunctionInfo(functionBody, this->GetRecycler());
            }
            else
            {
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                }
                dynamicProfileInfo = newDynamicProfileInfo;
            }
        }
        else
        {
            if (newDynamicProfileInfo == nullptr)
            {
                newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                dynamicProfileInfo = newDynamicProfileInfo;
            }
            Assert(functionBody->GetInterpretedCount() == 0);
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)

            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Prepend(this->GetRecycler(), newDynamicProfileInfo);
            }
#endif
            if (!startupComplete)
            {
                Assert(profileManager);
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
            }
        }
        Assert(dynamicProfileInfo != nullptr);
    }